

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O0

NoSelfMove * __thiscall
bssl::anon_unknown_0::InplaceVectorTest_EraseIf_Test::TestBody::NoSelfMove::operator=
          (NoSelfMove *this,NoSelfMove *other)

{
  NoSelfMove *other_local;
  NoSelfMove *this_local;
  
  if (this == other) {
    abort();
  }
  std::unique_ptr<int,_std::default_delete<int>_>::operator=(&this->v_,&other->v_);
  return this;
}

Assistant:

NoSelfMove &operator=(NoSelfMove &&other) {
      BSSL_CHECK(this != &other);
      v_ = std::move(other.v_);
      return *this;
    }